

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22118a::ParseDataSink::put
          (ParseDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  bool bVar1;
  undefined4 uVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  undefined1 local_f0 [8];
  UnicodeString str;
  undefined1 local_a8 [4];
  int k;
  ResourceArray array;
  undefined1 local_88 [3];
  bool isLenient;
  int j;
  ResourceTable strictnessTable;
  undefined1 local_58 [4];
  int i;
  ResourceTable contextsTable;
  UErrorCode *status_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  ParseDataSink *this_local;
  
  contextsTable._32_8_ = status;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(local_58,value,status);
  UVar3 = ::U_FAILURE(*(UErrorCode *)contextsTable._32_8_);
  if (UVar3 == '\0') {
    strictnessTable._36_4_ = 0;
    while (UVar3 = icu_63::ResourceTable::getKeyAndValue
                             ((ResourceTable *)local_58,strictnessTable._36_4_,(char **)&value_local
                              ,value), UVar3 != '\0') {
      iVar4 = strcmp((char *)value_local,"date");
      if (iVar4 != 0) {
        (*(value->super_UObject)._vptr_UObject[0xb])(local_88,value,contextsTable._32_8_);
        UVar3 = ::U_FAILURE(*(UErrorCode *)contextsTable._32_8_);
        if (UVar3 != '\0') {
          return;
        }
        array._20_4_ = 0;
        while (UVar3 = icu_63::ResourceTable::getKeyAndValue
                                 ((ResourceTable *)local_88,array._20_4_,(char **)&value_local,value
                                 ), UVar3 != '\0') {
          iVar4 = strcmp((char *)value_local,"lenient");
          array.length._3_1_ = iVar4 == 0;
          (*(value->super_UObject)._vptr_UObject[10])(local_a8,value,contextsTable._32_8_);
          UVar3 = ::U_FAILURE(*(UErrorCode *)contextsTable._32_8_);
          if (UVar3 != '\0') {
            return;
          }
          for (str.fUnion._52_4_ = 0; uVar2 = str.fUnion._52_4_,
              iVar5 = icu_63::ResourceArray::getSize((ResourceArray *)local_a8), (int)uVar2 < iVar5;
              str.fUnion._52_4_ = str.fUnion._52_4_ + 1) {
            icu_63::ResourceArray::getValue((ResourceArray *)local_a8,str.fUnion._52_4_,value);
            icu_63::ResourceValue::getUnicodeString
                      ((UnicodeString *)local_f0,value,(UErrorCode *)contextsTable._32_8_);
            UVar3 = ::U_FAILURE(*(UErrorCode *)contextsTable._32_8_);
            if (UVar3 == '\0') {
              iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'.');
              if (iVar5 == -1) {
                iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L',');
                if (iVar5 == -1) {
                  iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'+');
                  if (iVar5 == -1) {
                    iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'‒');
                    if (iVar5 == -1) {
                      iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'$');
                      if (iVar5 == -1) {
                        iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'£');
                        if (iVar5 == -1) {
                          iVar5 = icu_63::UnicodeString::indexOf((UnicodeString *)local_f0,L'₨');
                          if (iVar5 != -1) {
                            saveSet(RUPEE_SIGN,(UnicodeString *)local_f0,
                                    (UErrorCode *)contextsTable._32_8_);
                          }
                        }
                        else {
                          saveSet(POUND_SIGN,(UnicodeString *)local_f0,
                                  (UErrorCode *)contextsTable._32_8_);
                        }
                      }
                      else {
                        saveSet(DOLLAR_SIGN,(UnicodeString *)local_f0,
                                (UErrorCode *)contextsTable._32_8_);
                      }
                    }
                    else {
                      saveSet(MINUS_SIGN,(UnicodeString *)local_f0,
                              (UErrorCode *)contextsTable._32_8_);
                    }
                  }
                  else {
                    saveSet(PLUS_SIGN,(UnicodeString *)local_f0,(UErrorCode *)contextsTable._32_8_);
                  }
                }
                else {
                  saveSet(((byte)~array.length._3_1_ & 1) * 2 + COMMA,(UnicodeString *)local_f0,
                          (UErrorCode *)contextsTable._32_8_);
                }
              }
              else {
                saveSet(((byte)~array.length._3_1_ & 1) * 2 + PERIOD,(UnicodeString *)local_f0,
                        (UErrorCode *)contextsTable._32_8_);
              }
              UVar3 = ::U_FAILURE(*(UErrorCode *)contextsTable._32_8_);
              if (UVar3 == '\0') {
                bVar1 = false;
              }
              else {
                bVar1 = true;
              }
            }
            else {
              bVar1 = true;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_f0);
            if (bVar1) {
              return;
            }
          }
          array._20_4_ = array._20_4_ + 1;
        }
      }
      strictnessTable._36_4_ = strictnessTable._36_4_ + 1;
    }
  }
  return;
}

Assistant:

void put(const char* key, ResourceValue& value, UBool /*noFallback*/, UErrorCode& status) U_OVERRIDE {
        ResourceTable contextsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i = 0; contextsTable.getKeyAndValue(i, key, value); i++) {
            if (uprv_strcmp(key, "date") == 0) {
                // ignore
            } else {
                ResourceTable strictnessTable = value.getTable(status);
                if (U_FAILURE(status)) { return; }
                for (int j = 0; strictnessTable.getKeyAndValue(j, key, value); j++) {
                    bool isLenient = (uprv_strcmp(key, "lenient") == 0);
                    ResourceArray array = value.getArray(status);
                    if (U_FAILURE(status)) { return; }
                    for (int k = 0; k < array.getSize(); k++) {
                        array.getValue(k, value);
                        UnicodeString str = value.getUnicodeString(status);
                        if (U_FAILURE(status)) { return; }
                        // There is both lenient and strict data for comma/period,
                        // but not for any of the other symbols.
                        if (str.indexOf(u'.') != -1) {
                            saveSet(isLenient ? PERIOD : STRICT_PERIOD, str, status);
                        } else if (str.indexOf(u',') != -1) {
                            saveSet(isLenient ? COMMA : STRICT_COMMA, str, status);
                        } else if (str.indexOf(u'+') != -1) {
                            saveSet(PLUS_SIGN, str, status);
                        } else if (str.indexOf(u'‒') != -1) {
                            saveSet(MINUS_SIGN, str, status);
                        } else if (str.indexOf(u'$') != -1) {
                            saveSet(DOLLAR_SIGN, str, status);
                        } else if (str.indexOf(u'£') != -1) {
                            saveSet(POUND_SIGN, str, status);
                        } else if (str.indexOf(u'₨') != -1) {
                            saveSet(RUPEE_SIGN, str, status);
                        }
                        if (U_FAILURE(status)) { return; }
                    }
                }
            }
        }
    }